

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Definition.cpp
# Opt level: O1

void __thiscall
slang::ast::Definition::Definition
          (Definition *this,Scope *scope,LookupLocation lookupLocation,
          ModuleDeclarationSyntax *syntax,NetType *defaultNetType,UnconnectedDrive unconnectedDrive,
          optional<slang::TimeScale> directiveTimeScale,SyntaxTree *syntaxTree)

{
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *psVar1;
  pointer ppMVar2;
  SyntaxKind SVar3;
  ModuleHeaderSyntax *pMVar4;
  ModuleHeaderSyntax *pMVar5;
  PortListSyntax *pPVar6;
  ParameterPortListSyntax *syntax_00;
  size_type sVar7;
  MemberSyntax *this_00;
  ParameterDeclarationBaseSyntax *syntax_01;
  Token token;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_02;
  DefinitionKind DVar8;
  sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_> *psVar9;
  SourceLocation SVar10;
  optional<slang::ast::VariableLifetime> oVar11;
  TimeUnitsDeclarationSyntax *syntax_03;
  ParameterDeclarationStatementSyntax *pPVar12;
  ModportDeclarationSyntax *pMVar13;
  ModportItemSyntax *pMVar14;
  _Storage<slang::ast::VariableLifetime,_true> _Var15;
  ulong uVar16;
  size_t index;
  pointer ppMVar17;
  bool bVar18;
  bool isLocal;
  string_view sVar19;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar20;
  LookupLocation lookupLocation_00;
  optional<slang::SourceRange> precisionRange;
  optional<slang::SourceRange> unitsRange;
  string_view local_70;
  optional<slang::SourceRange> local_60;
  optional<slang::SourceRange> local_48;
  
  (this->name)._M_len = 0;
  (this->name)._M_str = (char *)0x0;
  this->location = (SourceLocation)0x0;
  this->syntax = syntax;
  this->defaultNetType = defaultNetType;
  this->scope = scope;
  this->unconnectedDrive = unconnectedDrive;
  (this->timeScale).base.unit = Seconds;
  (this->timeScale).base.magnitude = One;
  (this->timeScale).precision.unit = Seconds;
  (this->timeScale).precision.magnitude = One;
  (this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.data_ =
       (pointer)(this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.
                firstElement;
  (this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.len = 0;
  (this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>.cap = 8;
  psVar9 = ska::detailv3::empty_default_table<std::basic_string_view<char,std::char_traits<char>>>()
  ;
  (this->modports).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .entries = psVar9;
  (this->modports).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .num_slots_minus_one = 0;
  (this->modports).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .hash_policy = '?';
  (this->modports).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .max_lookups = '\x03';
  (this->modports).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ._max_load_factor = 0.5;
  (this->modports).
  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .num_elements = 0;
  (this->attributes).data_ = (pointer)0x0;
  (this->attributes).size_ = 0;
  this->syntaxTree = syntaxTree;
  this->instantiated = false;
  pMVar4 = (syntax->header).ptr;
  if (pMVar4 != (ModuleHeaderSyntax *)0x0) {
    sVar19 = parsing::Token::valueText(&pMVar4->name);
    this->name = sVar19;
    SVar10 = parsing::Token::location(&pMVar4->name);
    this->location = SVar10;
    this->indexInScope = lookupLocation.index;
    DVar8 = SemanticFacts::getDefinitionKind((syntax->super_MemberSyntax).super_SyntaxNode.kind);
    this->definitionKind = DVar8;
    token.kind = (pMVar4->lifetime).kind;
    token._2_1_ = (pMVar4->lifetime).field_0x2;
    token.numFlags.raw = (pMVar4->lifetime).numFlags.raw;
    token.rawLen = (pMVar4->lifetime).rawLen;
    token.info = (pMVar4->lifetime).info;
    oVar11 = SemanticFacts::getVariableLifetime(token);
    _Var15._M_value = Static;
    if (((ulong)oVar11.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::VariableLifetime> >> 0x20 & 1) != 0) {
      _Var15._M_value =
           oVar11.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::VariableLifetime>._M_payload;
    }
    this->defaultLifetime = (VariableLifetime)_Var15;
    psVar1 = &(syntax->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>;
    syntax_02.data_ = psVar1->data_;
    syntax_02.size_ = psVar1->size_;
    if ((syntax->super_MemberSyntax).attributes.
        super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ != 0 &&
        psVar1->data_ == (pointer)0x0) {
      std::terminate();
    }
    lookupLocation_00._12_4_ = 0;
    lookupLocation_00.scope = (Scope *)SUB128(lookupLocation._0_12_,0);
    lookupLocation_00.index = SUB124(lookupLocation._0_12_,8);
    sVar20 = AttributeSymbol::fromSyntax(syntax_02,scope,lookupLocation_00);
    this->attributes = sVar20;
    pMVar5 = (syntax->header).ptr;
    if (pMVar5 != (ModuleHeaderSyntax *)0x0) {
      pPVar6 = pMVar5->ports;
      if (pPVar6 == (PortListSyntax *)0x0) {
        bVar18 = false;
      }
      else {
        bVar18 = (pPVar6->super_SyntaxNode).kind == NonAnsiPortList;
      }
      this->hasNonAnsiPorts = bVar18;
      syntax_00 = pMVar4->parameters;
      if (syntax_00 != (ParameterPortListSyntax *)0x0) {
        ParameterBuilder::createDecls
                  (scope,syntax_00,
                   &(this->parameters).super_SmallVectorBase<slang::ast::Definition::ParameterDecl>)
        ;
      }
      local_48.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
      local_60.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged = false;
      sVar7 = (syntax->members).super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.
              size_;
      if (sVar7 != 0) {
        ppMVar17 = (syntax->members).
                   super_span<slang::syntax::MemberSyntax_*,_18446744073709551615UL>.data_;
        ppMVar2 = ppMVar17 + sVar7;
        bVar18 = true;
        do {
          this_00 = *ppMVar17;
          SVar3 = (this_00->super_SyntaxNode).kind;
          if (SVar3 == ModportDeclaration) {
            pMVar13 = slang::syntax::SyntaxNode::as<slang::syntax::ModportDeclarationSyntax>
                                (&this_00->super_SyntaxNode);
            uVar16 = (pMVar13->items).elements.size_ + 1;
            if (1 < uVar16) {
              index = 0;
              do {
                pMVar14 = slang::syntax::SeparatedSyntaxList<slang::syntax::ModportItemSyntax>::
                          operator[](&pMVar13->items,index);
                local_70 = parsing::Token::valueText(&pMVar14->name);
                ska::detailv3::
                sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
                ::emplace<std::basic_string_view<char,std::char_traits<char>>>
                          ((sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
                            *)&this->modports,&local_70);
                index = index + 1;
              } while (uVar16 >> 1 != index);
            }
LAB_00249585:
            bVar18 = false;
          }
          else if (SVar3 == ParameterDeclarationStatement) {
            pPVar12 = slang::syntax::SyntaxNode::
                      as<slang::syntax::ParameterDeclarationStatementSyntax>
                                (&this_00->super_SyntaxNode);
            syntax_01 = (pPVar12->parameter).ptr;
            if (syntax_01 == (ParameterDeclarationBaseSyntax *)0x0) {
              assert::assertFailed
                        ("ptr",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                         ,0x26,
                         "T slang::not_null<slang::syntax::ParameterDeclarationBaseSyntax *>::get() const [T = slang::syntax::ParameterDeclarationBaseSyntax *]"
                        );
            }
            isLocal = true;
            if (syntax_00 == (ParameterPortListSyntax *)0x0) {
              isLocal = (syntax_01->keyword).kind == LocalParamKeyword;
            }
            bVar18 = false;
            ParameterBuilder::createDecls
                      (scope,syntax_01,isLocal,false,
                       &(this->parameters).
                        super_SmallVectorBase<slang::ast::Definition::ParameterDecl>);
          }
          else {
            if (SVar3 != TimeUnitsDeclaration) goto LAB_00249585;
            syntax_03 = slang::syntax::SyntaxNode::as<slang::syntax::TimeUnitsDeclarationSyntax>
                                  (&this_00->super_SyntaxNode);
            SemanticFacts::populateTimeScale
                      (&this->timeScale,scope,syntax_03,&local_48,&local_60,bVar18);
          }
          ppMVar17 = ppMVar17 + 1;
        } while (ppMVar17 != ppMVar2);
      }
      SemanticFacts::populateTimeScale
                (&this->timeScale,scope,directiveTimeScale,
                 local_48.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::SourceRange>._M_engaged,
                 local_60.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::SourceRange>._M_engaged);
      return;
    }
  }
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,
             "T slang::not_null<slang::syntax::ModuleHeaderSyntax *>::get() const [T = slang::syntax::ModuleHeaderSyntax *]"
            );
}

Assistant:

Definition::Definition(const Scope& scope, LookupLocation lookupLocation,
                       const ModuleDeclarationSyntax& syntax, const NetType& defaultNetType,
                       UnconnectedDrive unconnectedDrive,
                       std::optional<TimeScale> directiveTimeScale, const SyntaxTree* syntaxTree) :
    syntax(syntax),
    defaultNetType(defaultNetType), scope(scope), unconnectedDrive(unconnectedDrive),
    syntaxTree(syntaxTree) {

    // Extract and save various properties of the definition.
    auto& header = *syntax.header;
    name = header.name.valueText();
    location = header.name.location();
    indexInScope = lookupLocation.getIndex();
    definitionKind = SemanticFacts::getDefinitionKind(syntax.kind);
    defaultLifetime =
        SemanticFacts::getVariableLifetime(header.lifetime).value_or(VariableLifetime::Static);
    attributes = AttributeSymbol::fromSyntax(syntax.attributes, scope, lookupLocation);
    hasNonAnsiPorts = syntax.header->ports &&
                      syntax.header->ports->kind == SyntaxKind::NonAnsiPortList;

    // Find all port parameters.
    bool hasPortParams = header.parameters != nullptr;
    if (hasPortParams)
        ParameterBuilder::createDecls(scope, *header.parameters, parameters);

    bool first = true;
    std::optional<SourceRange> unitsRange;
    std::optional<SourceRange> precisionRange;

    for (auto member : syntax.members) {
        if (member->kind == SyntaxKind::TimeUnitsDeclaration) {
            SemanticFacts::populateTimeScale(timeScale, scope,
                                             member->as<TimeUnitsDeclarationSyntax>(), unitsRange,
                                             precisionRange, first);
            continue;
        }

        first = false;
        if (member->kind == SyntaxKind::ModportDeclaration) {
            for (auto item : member->as<ModportDeclarationSyntax>().items)
                modports.emplace(item->name.valueText());
        }
        else if (member->kind == SyntaxKind::ParameterDeclarationStatement) {
            auto declaration = member->as<ParameterDeclarationStatementSyntax>().parameter;
            bool isLocal = hasPortParams ||
                           declaration->keyword.kind == TokenKind::LocalParamKeyword;

            ParameterBuilder::createDecls(scope, *declaration, isLocal, /* isPort */ false,
                                          parameters);
        }
    }

    SemanticFacts::populateTimeScale(timeScale, scope, directiveTimeScale, unitsRange.has_value(),
                                     precisionRange.has_value());
}